

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O1

JsValueRef
Debugger::RemoveBreakpoint
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode jsErrorCode;
  PAL_FILE *pPVar1;
  LPCWSTR pWVar2;
  char16_t *format;
  JsValueRef local_28;
  JsValueRef numberValue;
  int bpId;
  
  if (1 < argumentCount) {
    jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtConvertValueToNumber)
                            (arguments[1],&local_28);
    if (jsErrorCode == JsNoError) {
      jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                              (local_28,(int *)((long)&numberValue + 4));
      if (jsErrorCode == JsNoError) {
        jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagRemoveBreakpoint)
                                (numberValue._4_4_);
        if (jsErrorCode == JsNoError) {
          return (JsValueRef)0x0;
        }
        pPVar1 = PAL_get_stderr(0);
        pWVar2 = Helpers::JsErrorCodeToString(jsErrorCode);
        format = 
        L"ERROR: ChakraRTInterface::JsDiagRemoveBreakpoint(bpId) failed. JsErrorCode=0x%x (%s)\n";
      }
      else {
        pPVar1 = PAL_get_stderr(0);
        pWVar2 = Helpers::JsErrorCodeToString(jsErrorCode);
        format = 
        L"ERROR: ChakraRTInterface::JsNumberToInt(numberValue, &bpId) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
    }
    else {
      pPVar1 = PAL_get_stderr(0);
      pWVar2 = Helpers::JsErrorCodeToString(jsErrorCode);
      format = 
      L"ERROR: ChakraRTInterface::JsConvertValueToNumber(arguments[1], &numberValue) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    PAL_fwprintf(pPVar1,format,(ulong)jsErrorCode,pWVar2);
    pPVar1 = PAL_get_stderr(0);
    PAL_fflush(pPVar1);
  }
  return (JsValueRef)0x0;
}

Assistant:

JsValueRef Debugger::RemoveBreakpoint(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    int bpId;
    if (argumentCount > 1)
    {
        JsValueRef numberValue;
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsConvertValueToNumber(arguments[1], &numberValue));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(numberValue, &bpId));

        IfJsErrorFailLogAndRet(ChakraRTInterface::JsDiagRemoveBreakpoint(bpId));
    }

    return JS_INVALID_REFERENCE;
}